

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O1

TaprootBuilder * __thiscall
TaprootBuilder::Add(TaprootBuilder *this,int depth,Span<const_unsigned_char> script,int leaf_version
                   ,bool track)

{
  long in_FS_OFFSET;
  NodeInfo node;
  allocator_type local_b1;
  LeafInfo local_b0;
  undefined1 local_78 [8];
  undefined8 uStack_70;
  pointer local_68;
  uchar auStack_60 [8];
  vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((leaf_version & 0xffffff01U) != 0) {
    __assert_fail("(leaf_version & ~TAPROOT_LEAF_MASK) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/signingprovider.cpp"
                  ,0x170,
                  "TaprootBuilder &TaprootBuilder::Add(int, Span<const unsigned char>, int, bool)");
  }
  if (this->m_valid == true) {
    local_58.super__Vector_base<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.super__Vector_base<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68 = (pointer)0x0;
    auStack_60[0] = '\0';
    auStack_60[1] = '\0';
    auStack_60[2] = '\0';
    auStack_60[3] = '\0';
    auStack_60[4] = '\0';
    auStack_60[5] = '\0';
    auStack_60[6] = '\0';
    auStack_60[7] = '\0';
    local_78[0] = '\0';
    local_78[1] = '\0';
    local_78[2] = '\0';
    local_78[3] = '\0';
    local_78[4] = '\0';
    local_78[5] = '\0';
    local_78[6] = '\0';
    local_78[7] = '\0';
    uStack_70._0_1_ = '\0';
    uStack_70._1_1_ = '\0';
    uStack_70._2_1_ = '\0';
    uStack_70._3_1_ = '\0';
    uStack_70._4_1_ = '\0';
    uStack_70._5_1_ = '\0';
    uStack_70._6_1_ = '\0';
    uStack_70._7_1_ = '\0';
    local_58.super__Vector_base<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ComputeTapleafHash((uint256 *)&local_b0,(uint8_t)leaf_version,script);
    local_68 = local_b0.script.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_78 = (undefined1  [8])
               local_b0.script.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
    uStack_70 = local_b0.script.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    if (track) {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_b0,script.m_data,
                 script.m_data + script.m_size,&local_b1);
      local_b0.merkle_branch.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_b0.merkle_branch.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_b0.merkle_branch.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_b0.leaf_version = leaf_version;
      std::vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>::
      emplace_back<TaprootBuilder::LeafInfo>(&local_58,&local_b0);
      if (local_b0.merkle_branch.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b0.merkle_branch.super__Vector_base<uint256,_std::allocator<uint256>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_b0.merkle_branch.
                              super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_b0.merkle_branch.
                              super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_b0.script.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b0.script.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_b0.script.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_b0.script.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    Insert(this,(NodeInfo *)local_78,depth);
    std::vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>::~vector
              (&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

TaprootBuilder& TaprootBuilder::Add(int depth, Span<const unsigned char> script, int leaf_version, bool track)
{
    assert((leaf_version & ~TAPROOT_LEAF_MASK) == 0);
    if (!IsValid()) return *this;
    /* Construct NodeInfo object with leaf hash and (if track is true) also leaf information. */
    NodeInfo node;
    node.hash = ComputeTapleafHash(leaf_version, script);
    if (track) node.leaves.emplace_back(LeafInfo{std::vector<unsigned char>(script.begin(), script.end()), leaf_version, {}});
    /* Insert into the branch. */
    Insert(std::move(node), depth);
    return *this;
}